

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Implementation.hpp
# Opt level: O3

void __thiscall
CPU::Z80::Processor<AmstradCPC::ConcreteMachine<true>,_false,_true>::assemble_page
          (Processor<AmstradCPC::ConcreteMachine<true>,_false,_true> *this,InstructionPage *target,
          InstructionTable *table,bool add_offsets)

{
  long *plVar1;
  Type TVar2;
  MicroOp (*paMVar3) [30];
  Type *pTVar4;
  int c;
  long lVar5;
  MicroOp *pMVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  long lVar8;
  MicroOp *pMVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> operation_indices;
  size_t lengths [256];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_878;
  undefined4 local_85c;
  long local_858;
  MicroOp *local_850;
  value_type local_848;
  InstructionPage *local_840;
  ulong auStack_838 [257];
  
  local_85c = (undefined4)CONCAT71(in_register_00000009,add_offsets);
  lVar5 = 0;
  pMVar6 = (MicroOp *)table;
  lVar12 = 0;
  do {
    lVar8 = lVar12;
    uVar7 = 0;
    pMVar9 = pMVar6;
    do {
      paMVar3 = (MicroOp (*) [30])&pMVar9->type;
      uVar7 = uVar7 + 1;
      pMVar9 = pMVar9 + 1;
    } while (((*paMVar3)[0].type & ~IncrementR) != DecodeOperation);
    auStack_838[lVar5] = uVar7;
    lVar5 = lVar5 + 1;
    pMVar6 = pMVar6 + 0x1e;
    lVar12 = lVar8 + uVar7;
  } while (lVar5 != 0x100);
  local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
  ::reserve(&target->all_operations,lVar8 + uVar7);
  local_848 = (value_type)0x0;
  std::
  vector<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
  ::resize(&target->instructions,0x100,&local_848);
  local_850 = (*table)[0] + 1;
  lVar12 = 0;
  local_840 = target;
  do {
    local_848 = (value_type)
                ((long)(local_840->all_operations).
                       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_840->all_operations).
                       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6);
    if (local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_878,
                 (iterator)
                 local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(unsigned_long *)&local_848);
    }
    else {
      *local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish = (unsigned_long)local_848;
      local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar7 = auStack_838[lVar12];
    local_858 = lVar12;
    if (uVar7 != 0) {
      uVar11 = 0;
      do {
        TVar2 = (*table)[lVar12][uVar11].type;
        if (TVar2 == IndexedPlaceHolder) {
          uVar10 = uVar11 + 1;
          if ((char)local_85c == '\0') {
            pMVar6 = local_850 + uVar11;
            do {
              uVar10 = uVar10 + 1;
              pTVar4 = &pMVar6->type;
              pMVar6 = pMVar6 + 1;
            } while (*pTVar4 != CalculateIndexAddress);
          }
LAB_0025c0e4:
          std::
          vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
          ::emplace_back<CPU::Z80::ProcessorStorage::MicroOp&>
                    ((vector<CPU::Z80::ProcessorStorage::MicroOp,std::allocator<CPU::Z80::ProcessorStorage::MicroOp>>
                      *)&target->all_operations,(*table)[lVar12] + uVar10);
          uVar11 = uVar10;
        }
        else {
          uVar10 = uVar11;
          if ((TVar2 != BusOperation) ||
             ((*table)[lVar12][uVar11].machine_cycle.length.super_WrappedInt<HalfCycles>.length_ !=
              0)) goto LAB_0025c0e4;
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 < uVar7);
    }
    lVar12 = local_858 + 1;
    local_850 = local_850 + 0x1e;
    if (lVar12 == 0x100) {
      if (local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar12 = 0;
        do {
          plVar1 = (long *)((long)local_878.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar12);
          *(pointer *)
           ((long)(local_840->instructions).
                  super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp_*,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp_*>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar12) =
               (local_840->all_operations).
               super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
               ._M_impl.super__Vector_impl_data._M_start + *plVar1;
          lVar12 = lVar12 + 8;
        } while ((pointer)(plVar1 + 1) !=
                 local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      }
      if (local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
        operator_delete(local_878.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_878.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_878.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void Processor <T, uses_bus_request, uses_wait_line>
				::assemble_page(InstructionPage &target, InstructionTable &table, bool add_offsets) {
	std::size_t number_of_micro_ops = 0;
	std::size_t lengths[256];

	// Count number of micro-ops required.
	for(int c = 0; c < 256; c++) {
		std::size_t length = 0;
		while(!is_terminal(table[c][length].type)) length++;
		length++;
		lengths[c] = length;
		number_of_micro_ops += length;
	}

	// Allocate a landing area.
	std::vector<std::size_t> operation_indices;
	target.all_operations.reserve(number_of_micro_ops);
	target.instructions.resize(256, nullptr);

	// Copy in all programs, recording where they go.
	std::size_t destination = 0;
	for(std::size_t c = 0; c < 256; c++) {
		operation_indices.push_back(target.all_operations.size());
		for(std::size_t t = 0; t < lengths[c];) {
			// Skip zero-length bus cycles.
			if(table[c][t].type == MicroOp::BusOperation && table[c][t].machine_cycle.length.as_integral() == 0) {
				t++;
				continue;
			}

			// Skip optional waits if this instance doesn't use the wait line.
			if(table[c][t].machine_cycle.was_requested && !uses_wait_line) {
				t++;
				continue;
			}

			// If an index placeholder is hit then drop it, and if offsets aren't being added,
			// then also drop the indexing that follows, which is assumed to be everything
			// up to and including the next ::CalculateIndexAddress. Coupled to the INDEX() macro.
			if(table[c][t].type == MicroOp::IndexedPlaceHolder) {
				t++;
				if(!add_offsets) {
					while(table[c][t].type != MicroOp::CalculateIndexAddress) t++;
					t++;
				}
			}
			target.all_operations.emplace_back(table[c][t]);
			destination++;
			t++;
		}
	}

	// Since the vector won't change again, it's now safe to set pointers.
	std::size_t c = 0;
	for(std::size_t index : operation_indices) {
		target.instructions[c] = &target.all_operations[index];
		c++;
	}
}